

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket_io.hpp
# Opt level: O2

basic_endpoint<boost::asio::ip::udp> * __thiscall
libtorrent::aux::read_v4_endpoint<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>,char*&>
          (basic_endpoint<boost::asio::ip::udp> *__return_storage_ptr__,aux *this,char **in)

{
  undefined1 uVar1;
  undefined1 uVar2;
  undefined1 *puVar3;
  uint uVar4;
  address addr;
  address local_30;
  
  uVar4 = read_impl<unsigned_int,char*>(this);
  local_30.ipv4_address_.addr_.s_addr =
       (in4_addr_type)
       (uVar4 >> 0x18 | (uVar4 & 0xff0000) >> 8 | (uVar4 & 0xff00) << 8 | uVar4 << 0x18);
  local_30.type_ = ipv4;
  local_30.ipv6_address_.scope_id_ = 0;
  local_30.ipv6_address_.addr_.__in6_u._0_8_ = 0;
  local_30.ipv6_address_.addr_.__in6_u._8_8_ = 0;
  puVar3 = *(undefined1 **)this;
  uVar1 = *puVar3;
  *(undefined1 **)this = puVar3 + 1;
  uVar2 = puVar3[1];
  *(undefined1 **)this = puVar3 + 2;
  boost::asio::ip::detail::endpoint::endpoint
            (&__return_storage_ptr__->impl_,&local_30,CONCAT11(uVar1,uVar2));
  return __return_storage_ptr__;
}

Assistant:

Endpoint read_v4_endpoint(InIt&& in)
	{
		address addr = read_v4_address(in);
		std::uint16_t port = read_uint16(in);
		return Endpoint(addr, port);
	}